

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cpp
# Opt level: O0

void __thiscall Float_InfNanAreNotSupported_Test::TestBody(Float_InfNanAreNotSupported_Test *this)

{
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  Float_InfNanAreNotSupported_Test *local_10;
  Float_InfNanAreNotSupported_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Inf",&local_31);
  anon_unknown.dwarf_777f8::test_error(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"-Inf",&local_69);
  anon_unknown.dwarf_777f8::test_error(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"inf",&local_91);
  anon_unknown.dwarf_777f8::test_error(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"-inf",&local_b9);
  anon_unknown.dwarf_777f8::test_error(&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"INF",&local_e1);
  anon_unknown.dwarf_777f8::test_error(&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"-INF",&local_109);
  anon_unknown.dwarf_777f8::test_error(&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"NAN",&local_131);
  anon_unknown.dwarf_777f8::test_error(&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"NaN",&local_159);
  anon_unknown.dwarf_777f8::test_error(&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"Nan",&local_181);
  anon_unknown.dwarf_777f8::test_error(&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"nan",&local_1a9);
  anon_unknown.dwarf_777f8::test_error(&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  return;
}

Assistant:

TEST(Float, InfNanAreNotSupported) {
    test_error("Inf");
    test_error("-Inf");
    test_error("inf");
    test_error("-inf");
    test_error("INF");
    test_error("-INF");
    test_error("NAN");
    test_error("NaN");
    test_error("Nan");
    test_error("nan");
}